

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinType
          (Interpreter *this,LocationRange *param_1,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  Type TVar1;
  anon_union_8_3_4e909c26_for_v aVar2;
  Value VVar3;
  allocator<char32_t> local_29;
  UString local_28;
  
  TVar1 = ((args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start)->t;
  switch(TVar1) {
  case ARRAY:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_28,L"array",&local_29);
    VVar3 = makeString(this,&local_28);
    aVar2 = VVar3._0_8_;
    break;
  case FUNCTION:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_28,L"function",&local_29);
    VVar3 = makeString(this,&local_28);
    aVar2 = VVar3._0_8_;
    break;
  case OBJECT:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_28,L"object",&local_29);
    VVar3 = makeString(this,&local_28);
    aVar2 = VVar3._0_8_;
    break;
  case STRING:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_28,L"string",&local_29);
    VVar3 = makeString(this,&local_28);
    aVar2 = VVar3._0_8_;
    break;
  default:
    if (TVar1 == NUMBER) {
      std::__cxx11::u32string::u32string<std::allocator<char32_t>>
                ((u32string *)&local_28,L"number",&local_29);
      VVar3 = makeString(this,&local_28);
      aVar2 = VVar3._0_8_;
    }
    else if (TVar1 == BOOLEAN) {
      std::__cxx11::u32string::u32string<std::allocator<char32_t>>
                ((u32string *)&local_28,L"boolean",&local_29);
      VVar3 = makeString(this,&local_28);
      aVar2 = VVar3._0_8_;
    }
    else {
      if (TVar1 != NULL_TYPE) {
        return (AST *)0x0;
      }
      std::__cxx11::u32string::u32string<std::allocator<char32_t>>
                ((u32string *)&local_28,L"null",&local_29);
      VVar3 = makeString(this,&local_28);
      aVar2 = VVar3._0_8_;
    }
  }
  (this->scratch).t = STRING;
  (this->scratch).v = aVar2;
  std::__cxx11::u32string::~u32string((u32string *)&local_28);
  return (AST *)0x0;
}

Assistant:

const AST *builtinType(const LocationRange &, const std::vector<Value> &args)
    {
        switch (args[0].t) {
            case Value::NULL_TYPE: scratch = makeString(U"null"); return nullptr;

            case Value::BOOLEAN: scratch = makeString(U"boolean"); return nullptr;

            case Value::NUMBER: scratch = makeString(U"number"); return nullptr;

            case Value::ARRAY: scratch = makeString(U"array"); return nullptr;

            case Value::FUNCTION: scratch = makeString(U"function"); return nullptr;

            case Value::OBJECT: scratch = makeString(U"object"); return nullptr;

            case Value::STRING: scratch = makeString(U"string"); return nullptr;
        }
        return nullptr;  // Quiet, compiler.
    }